

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_path * mg_path_make(uint32_t node_count,mg_node **nodes,uint32_t relationship_count,
                      mg_unbound_relationship **relationships,uint32_t sequence_length,
                      int64_t *sequence)

{
  mg_path *pmVar1;
  uint32_t *__dest;
  size_t __n;
  ulong uVar2;
  
  uVar2 = (ulong)node_count;
  __n = (ulong)relationship_count * 8;
  pmVar1 = (mg_path *)
           mg_allocator_malloc(&mg_system_allocator,
                               uVar2 * 8 + __n + (ulong)sequence_length * 8 + 0x28);
  if (pmVar1 != (mg_path *)0x0) {
    pmVar1->nodes = (mg_node **)(pmVar1 + 1);
    __dest = &pmVar1[1].node_count + uVar2 * 2;
    pmVar1->relationships = (mg_unbound_relationship **)__dest;
    pmVar1->sequence = (int64_t *)(__dest + (ulong)relationship_count * 2);
    pmVar1->node_count = node_count;
    memcpy(pmVar1 + 1,nodes,uVar2 * 8);
    pmVar1->relationship_count = relationship_count;
    memcpy(__dest,relationships,__n);
    pmVar1->sequence_length = sequence_length;
    memcpy(pmVar1->sequence,sequence,(ulong)sequence_length << 3);
  }
  return pmVar1;
}

Assistant:

mg_path *mg_path_make(uint32_t node_count, mg_node **nodes,
                      uint32_t relationship_count,
                      mg_unbound_relationship **relationships,
                      uint32_t sequence_length, const int64_t *const sequence) {
  mg_path *path = mg_path_alloc(node_count, relationship_count, sequence_length,
                                &mg_system_allocator);
  if (!path) {
    return NULL;
  }
  path->node_count = node_count;
  memcpy(path->nodes, nodes, node_count * sizeof(mg_node *));
  path->relationship_count = relationship_count;
  memcpy(path->relationships, relationships,
         relationship_count * sizeof(mg_unbound_relationship *));
  path->sequence_length = sequence_length;
  memcpy(path->sequence, sequence, sequence_length * sizeof(int64_t));
  return path;
}